

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O0

iterator __thiscall
Type1ToType2Converter::MergeAltenratingOperators
          (Type1ToType2Converter *this,iterator inStartingNode,unsigned_short inAlternatingOpcode)

{
  unsigned_short uVar1;
  pointer pCVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pCVar5;
  bool bVar6;
  unsigned_short local_8a;
  const_iterator local_60;
  _List_node_base *local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_iterator<long> local_40;
  iterator local_38;
  const_iterator local_30;
  unsigned_short local_24;
  unsigned_short local_22;
  unsigned_short currentMarker;
  Type1ToType2Converter *pTStack_20;
  unsigned_short inAlternatingOpcode_local;
  Type1ToType2Converter *this_local;
  iterator inStartingNode_local;
  iterator itNext;
  
  local_22 = inAlternatingOpcode;
  pTStack_20 = this;
  this_local = (Type1ToType2Converter *)inStartingNode._M_node;
  inStartingNode_local = inStartingNode;
  std::_List_iterator<ConversionNode>::operator++(&inStartingNode_local);
  local_24 = local_22;
  while( true ) {
    uVar1 = local_24;
    pCVar2 = std::_List_iterator<ConversionNode>::operator->(&inStartingNode_local);
    bVar6 = false;
    if (uVar1 == pCVar2->mMarkerType) {
      pCVar2 = std::_List_iterator<ConversionNode>::operator->
                         ((_List_iterator<ConversionNode> *)&this_local);
      sVar3 = std::__cxx11::list<long,_std::allocator<long>_>::size(&pCVar2->mOperands);
      pCVar2 = std::_List_iterator<ConversionNode>::operator->(&inStartingNode_local);
      sVar4 = std::__cxx11::list<long,_std::allocator<long>_>::size(&pCVar2->mOperands);
      bVar6 = sVar3 + sVar4 < 0x28;
    }
    if (!bVar6) break;
    pCVar2 = std::_List_iterator<ConversionNode>::operator->
                       ((_List_iterator<ConversionNode> *)&this_local);
    pCVar5 = std::_List_iterator<ConversionNode>::operator->
                       ((_List_iterator<ConversionNode> *)&this_local);
    local_38._M_node =
         (_List_node_base *)std::__cxx11::list<long,_std::allocator<long>_>::end(&pCVar5->mOperands)
    ;
    std::_List_const_iterator<long>::_List_const_iterator(&local_30,&local_38);
    pCVar5 = std::_List_iterator<ConversionNode>::operator->(&inStartingNode_local);
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<long,_std::allocator<long>_>::begin(&pCVar5->mOperands);
    pCVar5 = std::_List_iterator<ConversionNode>::operator->(&inStartingNode_local);
    local_48 = (_List_node_base *)
               std::__cxx11::list<long,_std::allocator<long>_>::end(&pCVar5->mOperands);
    local_50 = (_List_node_base *)
               std::__cxx11::list<long,std::allocator<long>>::insert<std::_List_iterator<long>,void>
                         ((list<long,std::allocator<long>> *)&pCVar2->mOperands,local_30,local_40,
                          (_List_iterator<long>)local_48);
    std::_List_const_iterator<ConversionNode>::_List_const_iterator(&local_60,&inStartingNode_local)
    ;
    local_58 = (_List_node_base *)
               std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::erase
                         (&this->mConversionProgram,local_60);
    inStartingNode_local._M_node = local_58;
    pCVar2 = std::_List_iterator<ConversionNode>::operator->
                       ((_List_iterator<ConversionNode> *)&this_local);
    if (pCVar2->mMarkerType == local_24) {
      local_8a = local_22;
    }
    else {
      pCVar2 = std::_List_iterator<ConversionNode>::operator->
                         ((_List_iterator<ConversionNode> *)&this_local);
      local_8a = pCVar2->mMarkerType;
    }
    local_24 = local_8a;
  }
  return (iterator)inStartingNode_local._M_node;
}

Assistant:

ConversionNodeList::iterator Type1ToType2Converter::MergeAltenratingOperators(ConversionNodeList::iterator inStartingNode,
																			  unsigned short inAlternatingOpcode)
{
	ConversionNodeList::iterator itNext = inStartingNode;
	++itNext;
	unsigned short currentMarker = inAlternatingOpcode;

	while(currentMarker == itNext->mMarkerType && (inStartingNode->mOperands.size()  + itNext->mOperands.size() < scMergeLimit))
	{
		inStartingNode->mOperands.insert(inStartingNode->mOperands.end(),itNext->mOperands.begin(),itNext->mOperands.end());
		itNext = mConversionProgram.erase(itNext);
		currentMarker = inStartingNode->mMarkerType == currentMarker ? inAlternatingOpcode:inStartingNode->mMarkerType;
	}
	return itNext;
}